

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O0

uint32_t __thiscall cppnet::BufferBlock::FindStr(BufferBlock *this,char *s,uint32_t s_len)

{
  char *pcVar1;
  char *find_2;
  char *find_1;
  char *find;
  uint32_t s_len_local;
  char *s_local;
  BufferBlock *this_local;
  
  if (this->_read < this->_write) {
    pcVar1 = _FindStrInMem(this,this->_read,s,(int)this->_write - (int)this->_read,s_len);
    if (pcVar1 == (char *)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = ((int)pcVar1 - (int)this->_read) + s_len;
    }
  }
  else if (this->_write < this->_read) {
    pcVar1 = _FindStrInMem(this,this->_read,s,(int)this->_buffer_end - (int)this->_read,s_len);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = _FindStrInMem(this,this->_buffer_start,s,(int)this->_write - (int)this->_buffer_start
                             ,s_len);
      if (pcVar1 == (char *)0x0) {
        this_local._4_4_ = 0;
      }
      else {
        this_local._4_4_ =
             (((int)pcVar1 - (int)this->_buffer_start) + s_len + (int)this->_buffer_end) -
             (int)this->_read;
      }
    }
    else {
      this_local._4_4_ = ((int)pcVar1 - (int)this->_read) + s_len;
    }
  }
  else if ((this->_can_read & 1U) == 0) {
    this_local._4_4_ = 0;
  }
  else {
    pcVar1 = _FindStrInMem(this,this->_read,s,(int)this->_buffer_end - (int)this->_read,s_len);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = _FindStrInMem(this,this->_buffer_start,s,(int)this->_write - (int)this->_buffer_start
                             ,s_len);
      if (pcVar1 == (char *)0x0) {
        this_local._4_4_ = 0;
      }
      else {
        this_local._4_4_ =
             (((int)pcVar1 - (int)this->_buffer_start) + s_len + (int)this->_buffer_end) -
             (int)this->_read;
      }
    }
    else {
      this_local._4_4_ = ((int)pcVar1 - (int)this->_read) + s_len;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t BufferBlock::FindStr(const char* s, uint32_t s_len) {
    if (_write > _read) {
        const char* find = _FindStrInMem(_read, s, uint32_t(_write - _read), s_len);
        if (find) {
            return (uint32_t)(find - _read + s_len);
        }
        return 0;
        
    } else if (_write < _read) {
        const char* find = _FindStrInMem(_read, s, uint32_t(_buffer_end - _read), s_len);
        if (find) {
            return uint32_t(find - _read + s_len);
        }
        find = _FindStrInMem(_buffer_start, s, uint32_t(_write - _buffer_start), s_len);
        if (find) {
            return uint32_t(find - _buffer_start + s_len + _buffer_end - _read);
        }
        return 0;

    } else {
        if (_can_read) {
            const char* find = _FindStrInMem(_read, s, uint32_t(_buffer_end - _read), s_len);
            if (find) {
                return uint32_t(find - _read + s_len);
            }
            find = _FindStrInMem(_buffer_start, s, uint32_t(_write - _buffer_start), s_len);
            if (find) {
                return uint32_t(find - _buffer_start + s_len + _buffer_end - _read);
            }
            return 0;

        } else {
            return 0;
        }
    }
}